

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  FieldDescriptor *pFVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  uint32_t field_number;
  uint size;
  bool bVar9;
  Metadata MVar10;
  string message_data;
  byte *local_a8;
  undefined8 local_a0;
  byte local_98;
  undefined7 uStack_97;
  Reflection *local_88;
  CodedInputStream local_80;
  
  MVar10 = Message::GetMetadata(message);
  local_88 = MVar10.reflection;
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  iVar7 = 0;
  field_number = 0;
LAB_00262889:
  do {
    pbVar8 = input->buffer_;
    if (pbVar8 < input->buffer_end_) {
      uVar3 = (uint32_t)*pbVar8;
      if ((char)*pbVar8 < '\0') goto LAB_002628a3;
      input->buffer_ = pbVar8 + 1;
    }
    else {
      uVar3 = 0;
LAB_002628a3:
      uVar3 = io::CodedInputStream::ReadTagFallback(input,uVar3);
    }
    if ((int)uVar3 < 0x1a) {
      if (uVar3 == 0x10) {
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar4 = (ulong)bVar1;
          uVar3 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00262974;
          input->buffer_ = pbVar8 + 1;
          bVar9 = true;
        }
        else {
          uVar3 = 0;
LAB_00262974:
          uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar3);
          bVar9 = -1 < (long)uVar4;
        }
        bVar2 = false;
        if ((!bVar9) || (uVar3 = (uint32_t)uVar4, bVar2 = false, uVar3 == 0)) goto LAB_00262b00;
        if (iVar7 == 0) {
          iVar7 = 1;
          field_number = uVar3;
        }
        else if (iVar7 == 2) {
          local_80.buffer_ = local_a8;
          local_80.total_bytes_read_ = (int)local_a0;
          local_80.buffer_end_ = local_a8 + local_80.total_bytes_read_;
          local_80.input_ = (ZeroCopyInputStream *)0x0;
          local_80._28_7_ = 0;
          local_80._35_4_ = 0;
          local_80.buffer_size_after_limit_ = 0;
          local_80.total_bytes_limit_ = 0x7fffffff;
          local_80.extension_pool_ = (DescriptorPool *)0x0;
          local_80.extension_factory_ = (MessageFactory *)0x0;
          local_80.recursion_budget_ = input->recursion_budget_;
          local_80.current_limit_ = local_80.total_bytes_read_;
          local_80.recursion_limit_ = local_80.recursion_budget_;
          pFVar5 = Reflection::FindKnownExtensionByNumber(local_88,uVar3);
          bVar2 = ParseAndMergeMessageSetField(uVar3,pFVar5,message,&local_80);
          if (!bVar2) {
            io::CodedInputStream::~CodedInputStream(&local_80);
            goto LAB_00262afd;
          }
          local_a0 = 0;
          *local_a8 = 0;
          io::CodedInputStream::~CodedInputStream(&local_80);
          iVar7 = 3;
        }
        goto LAB_00262889;
      }
      if (uVar3 == 0) goto LAB_00262afd;
      if (uVar3 == 0xc) {
        bVar2 = true;
        goto LAB_00262b00;
      }
LAB_0026290e:
      bVar2 = SkipField(input,uVar3,(UnknownFieldSet *)0x0);
    }
    else {
      if (uVar3 != 0x1a) goto LAB_0026290e;
      if (iVar7 != 0) {
        if (iVar7 == 1) {
          pFVar5 = Reflection::FindKnownExtensionByNumber(local_88,field_number);
          bVar2 = ParseAndMergeMessageSetField(field_number,pFVar5,message,input);
          iVar7 = 3;
        }
        else {
          bVar2 = SkipField(input,0x1a,(UnknownFieldSet *)0x0);
        }
        goto LAB_0026291a;
      }
      pbVar8 = input->buffer_;
      if (pbVar8 < input->buffer_end_) {
        bVar1 = *pbVar8;
        uVar4 = (ulong)bVar1;
        uVar3 = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00262a58;
        input->buffer_ = pbVar8 + 1;
      }
      else {
        uVar3 = 0;
LAB_00262a58:
        uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar3);
        if ((uVar4 & 0x8000000080000000) != 0) goto LAB_00262afd;
      }
      size = (uint)uVar4;
      iVar7 = 0x1f;
      if ((size | 1) != 0) {
        for (; (size | 1) >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      std::__cxx11::string::resize((ulong)&local_a8,(char)(iVar7 * 9 + 0x49U >> 6) + (char)uVar4);
      pbVar8 = local_a8;
      if (size < 0x80) {
        uVar4 = uVar4 & 0xffffffff;
      }
      else {
        uVar4 = uVar4 & 0xffffffff;
        do {
          uVar6 = (uint)uVar4;
          *pbVar8 = (byte)uVar4 | 0x80;
          uVar4 = uVar4 >> 7;
          pbVar8 = pbVar8 + 1;
        } while (0x3fff < uVar6);
      }
      *pbVar8 = (byte)uVar4;
      bVar2 = io::CodedInputStream::ReadRaw(input,pbVar8 + 1,size);
      iVar7 = 2;
    }
LAB_0026291a:
    if (bVar2 == false) {
LAB_00262afd:
      bVar2 = false;
LAB_00262b00:
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      return bVar2;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}